

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O3

optional<unsigned_long_long> __thiscall
yactfr::internal::StrScanner::_tryScanConstInt<unsigned_long_long,10>(StrScanner *this,bool negate)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  ulonglong uVar3;
  int *piVar4;
  undefined8 uVar5;
  ulonglong in_RDX;
  ulonglong extraout_RDX;
  ulonglong extraout_RDX_00;
  ulonglong extraout_RDX_01;
  optional<unsigned_long_long> oVar6;
  char *strEnd;
  char *local_20;
  
  __nptr = this->_at;
  if ((ulong)((long)this->_end - (long)__nptr) < 2) {
    if (this->_end != __nptr) {
      cVar1 = *__nptr;
      goto LAB_0021bf8d;
    }
LAB_0021bf99:
    local_20 = (char *)0x0;
    uVar3 = strtoull(__nptr,&local_20,10);
    if ((uVar3 == 0) && (this->_at == local_20)) {
      piVar4 = __errno_location();
      in_RDX = extraout_RDX_01;
    }
    else {
      piVar4 = __errno_location();
      in_RDX = extraout_RDX_00;
      if (*piVar4 != 0x22) {
        in_RDX = -uVar3;
        if (!negate) {
          in_RDX = uVar3;
        }
        this->_at = local_20;
        uVar5 = CONCAT71((int7)((ulong)local_20 >> 8),1);
        goto LAB_0021bff6;
      }
    }
    *piVar4 = 0;
  }
  else {
    cVar1 = *__nptr;
    if (cVar1 == '0') {
      if ((byte)(__nptr[1] | 0x20U) != 0x78) {
        cVar1 = '0';
        goto LAB_0021bf8d;
      }
    }
    else {
LAB_0021bf8d:
      iVar2 = isxdigit((int)cVar1);
      in_RDX = extraout_RDX;
      if (iVar2 != 0) goto LAB_0021bf99;
    }
  }
  uVar5 = 0;
LAB_0021bff6:
  oVar6.super_type.m_storage = in_RDX;
  oVar6.super_type._0_8_ = uVar5;
  return (optional<unsigned_long_long>)oVar6.super_type;
}

Assistant:

boost::optional<ValT> StrScanner::_tryScanConstInt(const bool negate)
{
    /*
     * Only accept hex characters for the first two characters at this
     * point, as std::strtoull() will accept a hexadecimal radix prefix,
     * whitespaces, `-`, and `+`.
     */
    if (this->charsLeft() >= 2 && _at[0] == '0') {
        if (_at[1] == 'x' || _at[1] == 'X') {
            // we already scanned any prefix, if allowed
            return boost::none;
        }
    }

    if (this->charsLeft() >= 1 && !std::isxdigit(*_at)) {
        return boost::none;
    }

    char *strEnd = nullptr;
    const auto ullVal = std::strtoull(_at, &strEnd, BaseV);

    if ((ullVal == 0 && &(*_at) == strEnd) || errno == ERANGE) {
        // could not parse
        errno = 0;
        return boost::none;
    }

    {
        const auto val = this->_tryNegateConstInt<ValT>(ullVal, negate);

        if (val) {
            // success: update position
            _at += (strEnd - &(*_at));
        }

        return val;
    }
}